

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerResults.cpp
# Opt level: O2

void __thiscall
AsyncRgbLedAnalyzerResults::GenerateExportFile
          (AsyncRgbLedAnalyzerResults *this,char *file,DisplayBase display_base,
          U32 export_type_user_id)

{
  U8 bitSize;
  char cVar1;
  uint uVar2;
  ulonglong uVar3;
  ostream *poVar4;
  ulonglong uVar5;
  ulonglong uVar6;
  U8 webColor [3];
  RGBValue rgb;
  Frame frame;
  U64 local_310;
  char bs [16];
  char gs [16];
  char rs [16];
  char webBuf [8];
  char time_str [128];
  ofstream file_stream;
  
  std::ofstream::ofstream(&file_stream,file,_S_out);
  uVar3 = Analyzer::GetTriggerSample();
  uVar2 = Analyzer::GetSampleRate();
  poVar4 = std::operator<<((ostream *)&file_stream,
                           "Time [s], Packet ID, LED Index, Red, Green, Blue, Web-CSS");
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar5 = AnalyzerResults::GetNumFrames();
  uVar6 = 0;
  do {
    if (uVar5 == uVar6) {
      std::ofstream::close();
LAB_00107c53:
      std::ofstream::~ofstream(&file_stream);
      return;
    }
    AnalyzerResults::GetFrame((ulonglong)&frame);
    AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this);
    AnalyzerHelpers::GetTimeString(_frame,uVar3,uVar2,time_str,0x80);
    rgb = RGBValue::CreateFromU64(local_310);
    GenerateRGBStrings(this,&rgb,display_base,0x10,rs,gs,bs);
    bitSize = AsyncRgbLedAnalyzerSettings::BitSize(this->mSettings);
    RGBValue::ConvertTo8Bit(&rgb,bitSize,webColor);
    snprintf(webBuf,8,"#%02x%02x%02x",(ulong)webColor[0],(ulong)webColor[1],(ulong)webColor[2]);
    poVar4 = std::operator<<((ostream *)&file_stream,time_str);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar4);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar4);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = std::operator<<(poVar4,rs);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = std::operator<<(poVar4,gs);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = std::operator<<(poVar4,bs);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = std::operator<<(poVar4,webBuf);
    std::endl<char,std::char_traits<char>>(poVar4);
    cVar1 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar6);
    if (cVar1 != '\0') {
      std::ofstream::close();
      Frame::~Frame(&frame);
      goto LAB_00107c53;
    }
    Frame::~Frame(&frame);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void AsyncRgbLedAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    file_stream << "Time [s], Packet ID, LED Index, Red, Green, Blue, Web-CSS" << std::endl;

    const U64 num_frames = GetNumFrames();

    for( U64 i = 0; i < num_frames; i++ )
    {
        const Frame frame = GetFrame( i );
        U64 packetId = GetPacketContainingFrameSequential( num_frames );

        if( packetId == INVALID_RESULT_INDEX )
        {
            packetId = -1;
        }

        char time_str[ 128 ];
        AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

        RGBValue rgb = RGBValue::CreateFromU64( frame.mData1 );

        // RGB numerical value representation
        const size_t bufSize = 16;
        char rs[ bufSize ], gs[ bufSize ], bs[ bufSize ];
        GenerateRGBStrings( rgb, display_base, bufSize, rs, gs, bs );

        // CSS representation
        U8 webColor[ 3 ];
        rgb.ConvertTo8Bit( mSettings->BitSize(), webColor );
        char webBuf[ 8 ];
        ::snprintf( webBuf, sizeof( webBuf ), "#%02x%02x%02x", webColor[ 0 ], webColor[ 1 ], webColor[ 2 ] );

        file_stream << time_str << "," << packetId << "," << frame.mData2 << "," << rs << "," << gs << "," << bs << "," << webBuf
                    << std::endl;

        if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
        {
            file_stream.close();
            return;
        }
    }

    file_stream.close();
}